

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O2

void __thiscall QWidgetEffectSourcePrivate::update(QWidgetEffectSourcePrivate *this)

{
  this->updateDueToGraphicsEffect = true;
  QWidget::update(this->m_widget);
  this->updateDueToGraphicsEffect = false;
  return;
}

Assistant:

void update() override
    {
        updateDueToGraphicsEffect = true;
        m_widget->update();
        updateDueToGraphicsEffect = false;
    }